

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimagescale_sse4.cpp
# Opt level: O2

void qt_qimageScaleAARGBA_up_x_down_y_sse4<false>
               (QImageScaleInfo *isi,uint *dest,int dw,int dh,int dow,int sow)

{
  char cVar1;
  ulong uVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  anon_class_72_9_523e8b3d local_d0;
  longlong local_88 [2];
  int *yapoints;
  int *xapoints;
  int *xpoints;
  uint **ypoints;
  int sow_local;
  int dow_local;
  int dw_local;
  uint *dest_local;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0.dest = &dest_local;
  local_d0.dw = &dw_local;
  local_d0.dow = &dow_local;
  local_d0.sow = &sow_local;
  ypoints = isi->ypoints;
  local_d0.ypoints = &ypoints;
  xpoints = isi->xpoints;
  local_d0.xpoints = &xpoints;
  xapoints = isi->xapoints;
  local_d0.xapoints = &xapoints;
  yapoints = isi->yapoints;
  local_d0.yapoints = &yapoints;
  local_d0.v256 = &local_88;
  local_88[0] = 0x10000000100;
  local_88[1] = 0x10000000100;
  uVar2 = ((long)isi->sw * (long)isi->sh) / 0x10000;
  uVar6 = uVar2 & 0xffffffff;
  if (dh <= (int)uVar2) {
    uVar6 = (ulong)(uint)dh;
  }
  sow_local = sow;
  dow_local = dow;
  dw_local = dw;
  dest_local = dest;
  pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
  if ((pQVar3 != (QThreadPool *)0x0) && (1 < (int)uVar6)) {
    QThread::currentThread();
    cVar1 = QThreadPool::contains((QThread *)pQVar3);
    if (cVar1 == '\0') {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar7 = 0;
      QSemaphore::QSemaphore((QSemaphore *)&local_40,0);
      while( true ) {
        iVar8 = (int)uVar6;
        uVar6 = (ulong)(iVar8 - 1);
        if (iVar8 == 0) break;
        iVar8 = (dh - iVar7) / iVar8;
        puVar4 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar4 + 1) = 1;
        *puVar4 = QFactoryLoader::keyMap;
        puVar5 = (undefined8 *)operator_new(0x20);
        *puVar5 = QRunnable::QGenericRunnable::
                  Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qimagescale_sse4.cpp:34:31)>
                  ::impl;
        *(int *)(puVar5 + 1) = iVar7;
        *(int *)((long)puVar5 + 0xc) = iVar8;
        puVar5[2] = &local_d0;
        puVar5[3] = &local_40;
        puVar4[2] = puVar5;
        QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
        iVar7 = iVar7 + iVar8;
      }
      QSemaphore::acquire((int)(QSemaphore *)&local_40);
      QSemaphore::~QSemaphore((QSemaphore *)&local_40);
      goto LAB_0051a278;
    }
  }
  qt_qimageScaleAARGBA_up_x_down_y_sse4<false>::anon_class_72_9_523e8b3d::operator()(&local_d0,0,dh)
  ;
LAB_0051a278:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_qimageScaleAARGBA_up_x_down_y_sse4(QImageScaleInfo *isi, unsigned int *dest,
                                           int dw, int dh, int dow, int sow)
{
    const unsigned int **ypoints = isi->ypoints;
    const int *xpoints = isi->xpoints;
    const int *xapoints = isi->xapoints;
    const int *yapoints = isi->yapoints;

    const __m128i v256 = _mm_set1_epi32(256);

    /* go through every scanline in the output buffer */
    auto scaleSection = [&] (int yStart, int yEnd) {
        for (int y = yStart; y < yEnd; ++y) {
            const int Cy = yapoints[y] >> 16;
            const int yap = yapoints[y] & 0xffff;
            const __m128i vCy = _mm_set1_epi32(Cy);
            const __m128i vyap = _mm_set1_epi32(yap);

            unsigned int *dptr = dest + (y * dow);
            for (int x = 0; x < dw; x++) {
                const unsigned int *sptr = ypoints[y] + xpoints[x];
                __m128i vx = qt_qimageScaleAARGBA_helper(sptr, yap, Cy, sow, vyap, vCy);

                const int xap = xapoints[x];
                if (xap > 0) {
                    const __m128i vxap = _mm_set1_epi32(xap);
                    const __m128i vinvxap = _mm_sub_epi32(v256, vxap);
                    __m128i vr = qt_qimageScaleAARGBA_helper(sptr + 1, yap, Cy, sow, vyap, vCy);

                    vx = _mm_mullo_epi32(vx, vinvxap);
                    vr = _mm_mullo_epi32(vr, vxap);
                    vx = _mm_add_epi32(vx, vr);
                    vx = _mm_srli_epi32(vx, 8);
                }
                vx = _mm_srli_epi32(vx, 14);
                vx = _mm_packus_epi32(vx, vx);
                vx = _mm_packus_epi16(vx, vx);
                *dptr = _mm_cvtsi128_si32(vx);
                if (RGB)
                    *dptr |= 0xff000000;
                dptr++;
            }
        }
    };
    multithread_pixels_function(isi, dh, scaleSection);
}